

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

int snprintf_error_cnt(char *buf,size_t len,canfd_frame *cf)

{
  int iVar1;
  
  if (len != 0) {
    iVar1 = snprintf(buf,len,"{{%d}{%d}}",(ulong)cf->data[6],(ulong)cf->data[7]);
    return iVar1;
  }
  return 0;
}

Assistant:

static int snprintf_error_cnt(char *buf, size_t len, const struct canfd_frame *cf)
{
	int n = 0;

	if (len <= 0)
		return 0;

	n += snprintf(buf + n, len - n, "{{%d}{%d}}",
		      cf->data[6], cf->data[7]);

	return n;
}